

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<kj::StringPtr,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          int *params_2,char (*params_3) [12],String *params_4,char (*params_5) [2])

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff60;
  undefined1 local_98 [16];
  ArrayPtr<const_char> local_88;
  undefined8 local_78;
  long local_70;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_78 = *(undefined8 *)this;
  local_70 = *(long *)(this + 8) + -1;
  local_88.size_ = strlen((char *)params);
  local_88.ptr = (char *)params;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)params_1);
  local_98._8_8_ = strlen((char *)params_2);
  pcVar1 = *(char **)(*params_3 + 8);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)*params_3;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  local_98._0_8_ = params_2;
  local_68.size_ = strlen((char *)params_4);
  local_68.ptr = (char *)params_4;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_78,&local_88,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)local_98,&local_58,&local_68,in_stack_ffffffffffffff60);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}